

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.cpp
# Opt level: O2

void __thiscall Engine::printStats(Engine *this)

{
  uint uVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  uint i;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  
  lVar4 = std::chrono::_V2::steady_clock::now();
  lVar4 = lVar4 - (this->start_time).__d.__r;
  lVar5 = lVar4 / 1000000;
  lVar2 = (this->init_time).__r;
  printf("%%%%%%mzn-stat: nodes=%lld\n",this->nodes,lVar4 % 1000000);
  printf("%%%%%%mzn-stat: failures=%lld\n",this->conflicts);
  printf("%%%%%%mzn-stat: restarts=%d\n",(ulong)(uint)this->restart_count);
  printf("%%%%%%mzn-stat: variables=%d\n",(ulong)(sat.assigns.sz + (this->vars).sz));
  printf("%%%%%%mzn-stat: intVars=%d\n",(ulong)(this->vars).sz);
  printf("%%%%%%mzn-stat: boolVariables=%d\n",(ulong)(sat.assigns.sz - 2));
  printf("%%%%%%mzn-stat: propagators=%d\n",(ulong)(this->propagators).sz);
  printf("%%%%%%mzn-stat: propagations=%lld\n",this->propagations);
  printf("%%%%%%mzn-stat: peakDepth=%d\n",(ulong)(uint)this->peak_depth);
  printf("%%%%%%mzn-stat: nogoods=%lld\n",this->conflicts);
  printf("%%%%%%mzn-stat: backjumps=%lld\n",sat.back_jumps);
  printf("%%%%%%mzn-stat: peakMem=%.2f\n",0);
  printf("%%%%%%mzn-stat: time=%.3f\n",(double)lVar5 / 1000.0);
  printf("%%%%%%mzn-stat: initTime=%.3f\n",(double)(this->init_time).__r / 1000.0);
  printf("%%%%%%mzn-stat: solveTime=%.3f\n",(double)(lVar5 - lVar2) / 1000.0);
  if (this->opt_var != (IntVar *)0x0) {
    printf("%%%%%%mzn-stat: objective=%d\n",(ulong)(uint)this->best_sol);
    printf("%%%%%%mzn-stat: optTime=%.3f\n",(double)(this->opt_time).__r / 1000.0);
  }
  printf("%%%%%%mzn-stat: baseMem=%.2f\n",this->base_memory);
  printf("%%%%%%mzn-stat: trailMem=%.2f\n",
         (double)((ulong)(this->trail).cap << 4) * 9.5367431640625e-07);
  uVar8 = 0;
  printf("%%%%%%mzn-stat: randomSeed=%d\n",(ulong)(uint)so.rnd_seed);
  if (1 < so.verbosity) {
    uVar9 = 0;
    uVar1 = 0;
    uVar7 = 0;
    for (uVar6 = 0; uVar6 < (this->vars).sz; uVar6 = uVar6 + 1) {
      iVar3 = (*((this->vars).data[uVar6]->super_Var).super_Branching._vptr_Branching[3])();
      switch(iVar3) {
      case 1:
        uVar7 = uVar7 + 1;
        break;
      case 2:
        uVar8 = uVar8 + 1;
        break;
      case 3:
        uVar9 = uVar9 + 1;
        break;
      case 4:
        uVar1 = uVar1 + 1;
        break;
      default:
        fprintf(_stderr,"%s:%d: ","stats.cpp",0x43);
        fwrite("Assertion failed.\n",0x12,1,_stderr);
        abort();
      }
    }
    printf("%%%%%%mzn-stat: noLitIntVars=%d\n",(ulong)uVar7);
    printf("%%%%%%mzn-stat: eagerLitIntVars=%d\n",(ulong)uVar8);
    printf("%%%%%%mzn-stat: lazyLitIntVars=%d\n",(ulong)uVar9);
    printf("%%%%%%mzn-stat: sparseLitIntVars=%d\n",(ulong)uVar1);
    printf("%%%%%%mzn-stat: solutions=%lld\n",this->solutions);
    if (so.ldsb != false) {
      printf("%%%%%%mzn-stat: ldsbTime=%.3f\n",(double)ldsb.ldsb_time.__r / 1000.0);
    }
    SAT::printStats(&sat);
    if (so.mip == true) {
      (*(mip->super_Propagator)._vptr_Propagator[9])();
    }
    for (uVar6 = 0; uVar6 < engine.propagators.sz; uVar6 = uVar6 + 1) {
      (*engine.propagators.data[uVar6]->_vptr_Propagator[9])();
    }
  }
  printf("%%%%%%mzn-stat-end\n");
  return;
}

Assistant:

void Engine::printStats() {
	auto total_time = std::chrono::duration_cast<duration>(chuffed_clock::now() - start_time);
	const duration search_time = total_time - init_time;

	// MiniZinc standard statistics
	printf("%%%%%%mzn-stat: nodes=%lld\n", nodes);
	printf("%%%%%%mzn-stat: failures=%lld\n", conflicts);
	printf("%%%%%%mzn-stat: restarts=%d\n", restart_count);
	printf("%%%%%%mzn-stat: variables=%d\n", vars.size() + sat.nVars());
	printf("%%%%%%mzn-stat: intVars=%d\n", vars.size());
	printf("%%%%%%mzn-stat: boolVariables=%d\n", sat.nVars() - 2);  // Do not count constant
																																	// True/False
	//    printf("%%%%%%mzn-stat: floatVariables=%d\n", );
	//    printf("%%%%%%mzn-stat: setVariables=%d\n", );
	printf("%%%%%%mzn-stat: propagators=%d\n", propagators.size());
	printf("%%%%%%mzn-stat: propagations=%lld\n", propagations);
	printf("%%%%%%mzn-stat: peakDepth=%d\n", peak_depth);
	printf("%%%%%%mzn-stat: nogoods=%lld\n",
				 conflicts);  // TODO: Is this correct (e.g., sat.learnts.size())
	printf("%%%%%%mzn-stat: backjumps=%lld\n", sat.back_jumps);
	printf("%%%%%%mzn-stat: peakMem=%.2f\n", memUsed());
	printf("%%%%%%mzn-stat: time=%.3f\n", to_sec(total_time));
	printf("%%%%%%mzn-stat: initTime=%.3f\n", to_sec(init_time));
	printf("%%%%%%mzn-stat: solveTime=%.3f\n", to_sec(search_time));

	// Chuffed specific statistics
	if (opt_var != nullptr) {
		printf("%%%%%%mzn-stat: objective=%d\n", best_sol);
		printf("%%%%%%mzn-stat: optTime=%.3f\n", to_sec(opt_time));
	}
	printf("%%%%%%mzn-stat: baseMem=%.2f\n", base_memory);
	printf("%%%%%%mzn-stat: trailMem=%.2f\n", trail.capacity() * sizeof(TrailElem) / 1048576.0);
	printf("%%%%%%mzn-stat: randomSeed=%d\n", so.rnd_seed);

	if (so.verbosity >= 2) {
		int nl = 0;
		int el = 0;
		int ll = 0;
		int sl = 0;
		for (unsigned int i = 0; i < vars.size(); i++) {
			switch (vars[i]->getType()) {
				case INT_VAR:
					nl++;
					break;
				case INT_VAR_EL:
					el++;
					break;
				case INT_VAR_LL:
					ll++;
					break;
				case INT_VAR_SL:
					sl++;
					break;
				default:
					NEVER;
			}
		}
		printf("%%%%%%mzn-stat: noLitIntVars=%d\n", nl);
		printf("%%%%%%mzn-stat: eagerLitIntVars=%d\n", el);
		printf("%%%%%%mzn-stat: lazyLitIntVars=%d\n", ll);
		printf("%%%%%%mzn-stat: sparseLitIntVars=%d\n", sl);
		printf("%%%%%%mzn-stat: solutions=%lld\n", solutions);

		if (so.ldsb) {
			printf("%%%%%%mzn-stat: ldsbTime=%.3f\n", to_sec(ldsb.ldsb_time));
		}
		sat.printStats();
		/* sat.printLearntStats(); */
		if (so.mip) {
			mip->printStats();
		}
		for (unsigned int i = 0; i < engine.propagators.size(); i++) {
			engine.propagators[i]->printStats();
		}
	}
	printf("%%%%%%mzn-stat-end\n");
}